

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportSet.h
# Opt level: O0

void __thiscall cmExportSet::cmExportSet(cmExportSet *this,string *name)

{
  string *name_local;
  cmExportSet *this_local;
  
  std::vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>::vector(&this->TargetExports);
  std::__cxx11::string::string((string *)&this->Name,(string *)name);
  std::vector<const_cmInstallExportGenerator_*,_std::allocator<const_cmInstallExportGenerator_*>_>::
  vector(&this->Installations);
  return;
}

Assistant:

cmExportSet(const std::string &name) : Name(name) {}